

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall icu_63::RBBITableBuilder::flagLookAheadStates(RBBITableBuilder *this)

{
  int32_t iVar1;
  void *obj;
  void *pvVar2;
  int index;
  UVector *this_00;
  int32_t index_00;
  UVector lookAheadNodes;
  UVector UStack_58;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    UVector::UVector(&UStack_58,this->fStatus);
    RBBINode::findNodes(*this->fTree,&UStack_58,lookAhead,this->fStatus);
    if ((*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) && (0 < UStack_58.count)) {
      index = 0;
      do {
        obj = UVector::elementAt(&UStack_58,index);
        this_00 = this->fDStates;
        if (0 < this_00->count) {
          index_00 = 0;
          do {
            pvVar2 = UVector::elementAt(this_00,index_00);
            iVar1 = UVector::indexOf(*(UVector **)((long)pvVar2 + 0x20),obj,0);
            if (-1 < iVar1) {
              *(undefined4 *)((long)pvVar2 + 8) = *(undefined4 *)((long)obj + 0x7c);
            }
            index_00 = index_00 + 1;
            this_00 = this->fDStates;
          } while (index_00 < this_00->count);
        }
        index = index + 1;
      } while (index < UStack_58.count);
    }
    UVector::~UVector(&UStack_58);
  }
  return;
}

Assistant:

void     RBBITableBuilder::flagLookAheadStates() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    UVector     lookAheadNodes(*fStatus);
    RBBINode    *lookAheadNode;
    int32_t     i;
    int32_t     n;

    fTree->findNodes(&lookAheadNodes, RBBINode::lookAhead, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    for (i=0; i<lookAheadNodes.size(); i++) {
        lookAheadNode = (RBBINode *)lookAheadNodes.elementAt(i);

        for (n=0; n<fDStates->size(); n++) {
            RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
            if (sd->fPositions->indexOf(lookAheadNode) >= 0) {
                sd->fLookAhead = lookAheadNode->fVal;
            }
        }
    }
}